

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O3

void __thiscall icu_63::UnicodeSet::UnicodeSet(UnicodeSet *this)

{
  uint in_EAX;
  UChar32 *pUVar1;
  UErrorCode status;
  undefined8 uStack_18;
  
  (this->super_UnicodeFilter).super_UnicodeFunctor.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeSet_00487cb8;
  (this->super_UnicodeFilter).super_UnicodeMatcher._vptr_UnicodeMatcher =
       (_func_int **)&PTR__UnicodeSet_00487dd0;
  this->len = 1;
  this->capacity = 0x11;
  this->list = (UChar32 *)0x0;
  this->bmpSet = (BMPSet *)0x0;
  this->buffer = (UChar32 *)0x0;
  this->bufferCapacity = 0;
  this->patLen = 0;
  this->pat = (char16_t *)0x0;
  this->strings = (UVector *)0x0;
  *(undefined8 *)((long)&this->strings + 1) = 0;
  *(undefined8 *)((long)&this->stringSpan + 1) = 0;
  uStack_18 = (ulong)in_EAX;
  allocateStrings(this,(UErrorCode *)((long)&uStack_18 + 4));
  if (uStack_18._4_4_ < 1) {
    pUVar1 = (UChar32 *)uprv_malloc_63((long)this->capacity << 2);
    this->list = pUVar1;
    if (pUVar1 != (UChar32 *)0x0) {
      *pUVar1 = 0x110000;
      return;
    }
    clear(this);
  }
  else {
    clear(this);
  }
  this->fFlags = '\x01';
  return;
}

Assistant:

UnicodeSet::UnicodeSet() :
    len(1), capacity(1 + START_EXTRA), list(0), bmpSet(0), buffer(0),
    bufferCapacity(0), patLen(0), pat(NULL), strings(NULL), stringSpan(NULL),
    fFlags(0)
{
    UErrorCode status = U_ZERO_ERROR;
    allocateStrings(status);
    if (U_FAILURE(status)) {
        setToBogus(); // If memory allocation failed, set to bogus state.
        return;
    }
    list = (UChar32*) uprv_malloc(sizeof(UChar32) * capacity);
    if(list!=NULL){
        list[0] = UNICODESET_HIGH;
    } else { // If memory allocation failed, set to bogus state.
        setToBogus();
        return;
    }
    _dbgct(this);
}